

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

char * __thiscall Corrade::Containers::String::release(String *this)

{
  char *pcVar1;
  ostream *output;
  Error local_30;
  
  if (((this->field_0)._small.size & 0x40) == 0) {
    pcVar1 = (this->field_0)._large.data;
    (this->field_0)._small.data[0] = '\0';
    (this->field_0)._small.size = '@';
    return pcVar1;
  }
  output = Utility::Error::defaultOutput();
  Utility::Error::Error(&local_30,output,(Flags)0x0);
  Utility::Debug::operator<<
            (&local_30.super_Debug,"Containers::String::release(): cannot call on a SSO instance");
  Utility::Error::~Error(&local_30);
  abort();
}

Assistant:

char* String::release() {
    /* Unlikely to be called very often, so a non-debug assert is fine */
    CORRADE_ASSERT(!(_small.size & Implementation::SmallStringBit),
        "Containers::String::release(): cannot call on a SSO instance", {});
    char* data = _large.data;

    /* Create a zero-size small string to fullfil the guarantee of data() being
       always non-null and null-terminated. Since this makes the string switch
       to SSO, we also clear the deleter this way. */
    _small.data[0] = '\0';
    _small.size = Implementation::SmallStringBit;
    return data;
}